

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

size_t bitset_symmetric_difference_count(bitset_t *b1,bitset_t *b2)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar3 = b1->arraysize;
  uVar4 = b2->arraysize;
  uVar2 = uVar4;
  if (uVar3 < uVar4) {
    uVar2 = uVar3;
  }
  if (uVar2 == 0) {
    uVar2 = 0;
    sVar1 = 0;
  }
  else {
    sVar1 = 0;
    uVar5 = 0;
    do {
      uVar6 = b2->array[uVar5] ^ b1->array[uVar5];
      uVar6 = uVar6 - (uVar6 >> 1 & 0x5555555555555555);
      uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
      sVar1 = sVar1 + (((uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  if (uVar3 < uVar4) {
    if (uVar2 < uVar4) {
      do {
        uVar3 = b2->array[uVar2] - (b2->array[uVar2] >> 1 & 0x5555555555555555);
        uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
        sVar1 = sVar1 + (((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
        uVar2 = uVar2 + 1;
      } while (uVar4 != uVar2);
    }
  }
  else if (uVar2 < uVar3) {
    do {
      uVar4 = b1->array[uVar2] - (b1->array[uVar2] >> 1 & 0x5555555555555555);
      uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
      sVar1 = sVar1 + (((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  return sVar1;
}

Assistant:

size_t  bitset_symmetric_difference_count(const bitset_t * CBITSET_RESTRICT b1, const bitset_t * CBITSET_RESTRICT b2) {
  size_t minlength = b1->arraysize < b2->arraysize ? b1->arraysize : b2->arraysize;
  size_t k = 0;
  size_t answer = 0;
  for( ; k < minlength; ++k) {
    answer += cbitset_hamming(b1->array[k] ^ b2->array[k]);
  }
  if(b2->arraysize > b1->arraysize) {
    for( ; k < b2->arraysize; ++k) {
      answer += cbitset_hamming(b2->array[k]);
    }
  } else {
    for( ; k < b1->arraysize; ++k) {
      answer += cbitset_hamming(b1->array[k]);
    }
  }
  return answer;
}